

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::moveOrderDown(PatternModel *this)

{
  OrderSwapCmd *this_00;
  QUndoStack *pQVar1;
  QArrayDataPointer<char16_t> local_30;
  
  this_00 = (OrderSwapCmd *)operator_new(0x20);
  OrderSwapCmd::OrderSwapCmd(this_00,this,this->mCursorPattern,this->mCursorPattern + 1);
  tr((QString *)&local_30,"move order down",(char *)0x0,-1);
  QUndoCommand::setText((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar1 = Module::undoStack(this->mModule);
  QUndoStack::push((QUndoCommand *)pQVar1);
  return;
}

Assistant:

void PatternModel::moveOrderDown() {
    auto cmd = new OrderSwapCmd(*this, mCursorPattern, mCursorPattern + 1);
    cmd->setText((tr("move order down")));
    mModule.undoStack()->push(cmd);
}